

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_tec(REF_INTERP ref_interp,char *filename)

{
  REF_NODE pRVar1;
  FILE *__stream;
  int local_3c;
  REF_INT item;
  FILE *file;
  REF_NODE ref_node;
  REF_GRID to_grid;
  char *filename_local;
  REF_INTERP ref_interp_local;
  
  pRVar1 = ref_interp->to_grid->node;
  if (ref_interp->visualize->n == 0) {
    ref_interp_local._4_4_ = 0;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x9dd,"ref_interp_tec","unable to open file");
      ref_interp_local._4_4_ = 2;
    }
    else {
      fprintf(__stream,"title=\"refine interp\"\n");
      fprintf(__stream,"variables = \"x\" \"y\" \"z\"\n");
      fprintf(__stream,"zone t=\"exhaust\", i=%d, datapacking=%s\n",
              (ulong)(uint)ref_interp->visualize->n,"point");
      for (local_3c = 0; local_3c < ref_interp->visualize->n; local_3c = local_3c + 1) {
        fprintf(__stream,"%.15e %.15e %.15e\n",
                pRVar1->real[ref_interp->visualize->value[local_3c] * 0xf],
                pRVar1->real[ref_interp->visualize->value[local_3c] * 0xf + 1],
                pRVar1->real[ref_interp->visualize->value[local_3c] * 0xf + 2]);
      }
      fclose(__stream);
      ref_interp_local._4_4_ = 0;
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_tec(REF_INTERP ref_interp, const char *filename) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_NODE ref_node = ref_grid_node(to_grid);
  FILE *file;
  REF_INT item;

  /* skip if noting to show */
  if (0 == ref_list_n(ref_interp->visualize)) return REF_SUCCESS;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine interp\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(file, "zone t=\"exhaust\", i=%d, datapacking=%s\n",
          ref_list_n(ref_interp->visualize), "point");

  each_ref_list_item(ref_interp->visualize, item) fprintf(
      file, "%.15e %.15e %.15e\n",
      ref_node_xyz(ref_node, 0, ref_list_value(ref_interp->visualize, item)),
      ref_node_xyz(ref_node, 1, ref_list_value(ref_interp->visualize, item)),
      ref_node_xyz(ref_node, 2, ref_list_value(ref_interp->visualize, item)));

  fclose(file);
  return REF_SUCCESS;
}